

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O1

bool __thiscall QStringView::startsWith(QStringView *this,QStringView s,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  int iVar2;
  storage_type_conflict *psVar3;
  QStringView lhs;
  
  psVar3 = (storage_type_conflict *)s.m_size;
  psVar1 = s.m_data;
  if ((this->m_data != (storage_type_conflict *)0x0) && (psVar1 = psVar3, this->m_size != 0)) {
    if ((long)psVar3 <= this->m_size) {
      lhs.m_size = (qsizetype)psVar3;
      lhs.m_data = this->m_data;
      iVar2 = QtPrivate::compareStrings(lhs,s,cs);
      return iVar2 == 0;
    }
    return false;
  }
  return psVar1 == (storage_type_conflict *)0x0;
}

Assistant:

[[nodiscard]] bool startsWith(QStringView s, Qt::CaseSensitivity cs = Qt::CaseSensitive) const noexcept
    { return QtPrivate::startsWith(*this, s, cs); }